

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall
QNetworkProxy::setRawHeader(QNetworkProxy *this,QByteArray *headerName,QByteArray *headerValue)

{
  QNetworkProxyPrivate *pQVar1;
  QByteArray *in_RDX;
  QNetworkHeadersPrivate *in_RSI;
  QByteArray *in_RDI;
  
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RDI);
  if ((pQVar1->type != HttpProxy) &&
     (pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                         ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RDI),
     pQVar1->type != HttpCachingProxy)) {
    return;
  }
  QSharedDataPointer<QNetworkProxyPrivate>::operator->
            ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RDI);
  QNetworkHeadersPrivate::setRawHeader(in_RSI,in_RDX,in_RDI);
  return;
}

Assistant:

void QNetworkProxy::setRawHeader(const QByteArray &headerName, const QByteArray &headerValue)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setRawHeader(headerName, headerValue);
}